

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bformatdec.cpp
# Opt level: O3

unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_> __thiscall
BFormatDec::Create(BFormatDec *this,AmbDecConf *conf,bool allow_2band,size_t inchans,ALuint srate,
                  ALuint (*chanmap) [16],
                  unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *stablizer)

{
  BFormatDec *this_00;
  _Head_base<0UL,_FrontStablizer_*,_false> local_40;
  ALuint (*local_38) [16];
  
  local_38 = chanmap;
  this_00 = (BFormatDec *)operator_new(0x20b0,inchans);
  local_40._M_head_impl =
       (stablizer->_M_t).super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>
       ._M_t.super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
       super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl;
  (stablizer->_M_t).super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>._M_t
  .super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
  super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl = (FrontStablizer *)0x0;
  BFormatDec(this_00,conf,allow_2band,inchans,srate,local_38,
             (unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)&local_40);
  *(BFormatDec **)(this->mSamples)._M_elems[0]._M_elems = this_00;
  if (local_40._M_head_impl != (FrontStablizer *)0x0) {
    al_free(local_40._M_head_impl);
  }
  return (__uniq_ptr_data<BFormatDec,_std::default_delete<BFormatDec>,_true,_true>)
         (__uniq_ptr_data<BFormatDec,_std::default_delete<BFormatDec>,_true,_true>)this;
}

Assistant:

std::unique_ptr<BFormatDec> BFormatDec::Create(const AmbDecConf *conf, const bool allow_2band,
    const size_t inchans, const ALuint srate, const ALuint (&chanmap)[MAX_OUTPUT_CHANNELS],
    std::unique_ptr<FrontStablizer> stablizer)
{
    return std::unique_ptr<BFormatDec>{new(FamCount(inchans))
        BFormatDec{conf, allow_2band, inchans, srate, chanmap, std::move(stablizer)}};
}